

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_consume_scalar(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  State *pSVar3;
  uint uVar4;
  csubstr cVar5;
  
  pSVar3 = this->m_state;
  uVar4 = pSVar3->flags;
  if ((uVar4 >> 9 & 1) == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        cVar5 = (csubstr)(*pcVar1)();
        return cVar5;
      }
    }
    (*(code *)PTR_error_impl_00297798)
              ("check failed: m_state->flags & SSCL",0x23,(anonymous_namespace)::s_default_callbacks
              );
    pSVar3 = this->m_state;
    uVar4 = pSVar3->flags;
  }
  cVar5 = pSVar3->scalar;
  pSVar3->flags = uVar4 & 0xfffff9ff;
  (pSVar3->scalar).str = (char *)0x0;
  (pSVar3->scalar).len = 0;
  return cVar5;
}

Assistant:

csubstr Parser::_consume_scalar()
{
    _c4dbgpf("state[{}]: consuming scalar '{}' (flag: {}))", m_state-m_stack.begin(), m_state->scalar, m_state->flags & SSCL);
    RYML_CHECK(m_state->flags & SSCL);
    csubstr s = m_state->scalar;
    rem_flags(SSCL | QSCL);
    m_state->scalar.clear();
    return s;
}